

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void dequantize_row_q4_1(void *x,float *y,int k)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  uint uVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  
  iVar6 = k + 0x1f;
  if (-1 < k) {
    iVar6 = k;
  }
  if (0x1f < k) {
    uVar7 = iVar6 >> 5;
    pvVar8 = (void *)((long)x + (long)(int)uVar7 * 8);
    uVar9 = 0;
    auVar11[8] = 0xf;
    auVar11._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar11[9] = 0xf;
    auVar11[10] = 0xf;
    auVar11[0xb] = 0xf;
    auVar11[0xc] = 0xf;
    auVar11[0xd] = 0xf;
    auVar11[0xe] = 0xf;
    auVar11[0xf] = 0xf;
    do {
      uVar1 = *(undefined4 *)((long)x + uVar9 * 4 + (long)(int)uVar7 * 4);
      auVar12._4_4_ = uVar1;
      auVar12._0_4_ = uVar1;
      auVar12._8_4_ = uVar1;
      auVar12._12_4_ = uVar1;
      auVar12._16_4_ = uVar1;
      auVar12._20_4_ = uVar1;
      auVar12._24_4_ = uVar1;
      auVar12._28_4_ = uVar1;
      uVar1 = *(undefined4 *)((long)x + uVar9 * 4);
      auVar13._4_4_ = uVar1;
      auVar13._0_4_ = uVar1;
      auVar13._8_4_ = uVar1;
      auVar13._12_4_ = uVar1;
      auVar13._16_4_ = uVar1;
      auVar13._20_4_ = uVar1;
      auVar13._24_4_ = uVar1;
      auVar13._28_4_ = uVar1;
      lVar10 = 0;
      do {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)((long)pvVar8 + lVar10);
        auVar2 = vpand_avx(auVar14,auVar11);
        auVar14 = vpsrlw_avx(auVar14,4);
        auVar14 = vpand_avx(auVar14,auVar11);
        auVar5 = vpmovzxbd_avx2(auVar2);
        auVar5 = vcvtdq2ps_avx(auVar5);
        auVar2 = vfmadd213ps_fma(auVar5,auVar12,auVar13);
        auVar5 = vpmovzxbd_avx2(auVar14);
        auVar5 = vcvtdq2ps_avx(auVar5);
        auVar14 = vfmadd213ps_fma(auVar5,auVar12,auVar13);
        auVar5 = vunpckhps_avx(ZEXT1632(auVar2),ZEXT1632(auVar14));
        auVar3 = vunpcklps_avx(ZEXT1632(auVar2),ZEXT1632(auVar14));
        auVar4 = vperm2f128_avx(auVar3,auVar5,0x20);
        auVar5 = vperm2f128_avx(auVar3,auVar5,0x31);
        *(undefined1 (*) [32])(y + lVar10 * 2 + 8) = auVar5;
        *(undefined1 (*) [32])(y + lVar10 * 2) = auVar4;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x10);
      uVar9 = uVar9 + 1;
      pvVar8 = (void *)((long)pvVar8 + 0x10);
      y = y + 0x20;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

void dequantize_row_q4_1(const void * restrict x, float * restrict y, int k) {
    assert(k % QK == 0);

    const int nb = k / QK;

    const float   * restrict pm = (const float *)   (x);
    const float   * restrict pd = (const float *)   (pm + nb);
    const uint8_t * restrict pb = (const uint8_t *) (pd + nb);

    for (int i = 0; i < nb; i++) {
        const float m = pm[i];
        const float d = pd[i];

        const uint8_t * restrict pp = pb + i*QK/2;

        for (int l = 0; l < QK; l += 2) {
            const uint8_t vi = pp[l/2];

            const int8_t vi0 = vi & 0xf;
            const int8_t vi1 = vi >> 4;

            const float v0 = vi0*d + m;
            const float v1 = vi1*d + m;

            y[i*QK + l + 0] = v0;
            y[i*QK + l + 1] = v1;

            assert(!isnan(y[i*QK + l + 0]));
            assert(!isnan(y[i*QK + l + 1]));
        }
    }
}